

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
          (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int vertices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar6;
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar7;
  ulong uVar8;
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_90;
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  int local_28;
  int i;
  int vertices_local;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->vertexCount = vertices;
  uVar3 = (ulong)vertices;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar8 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar8);
  *puVar5 = uVar3;
  pSVar6 = (SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_58 = pSVar6;
    do {
      SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::SinglyLinkedList(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != pSVar6 + uVar3);
  }
  this->adjacencyList = pSVar6;
  uVar3 = (ulong)vertices;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0x48),0);
  uVar8 = uVar4 + 8;
  if (SUB168(auVar2 * ZEXT816(0x48),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar8);
  *puVar5 = uVar3;
  pGVar7 = (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_90 = pGVar7;
    do {
      GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::GraphVertex(local_90);
      local_90 = local_90 + 1;
    } while (local_90 != pGVar7 + uVar3);
  }
  this->vertexList = pGVar7;
  for (local_28 = 0; local_28 < this->vertexCount; local_28 = local_28 + 1) {
    GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    setIndex(this->vertexList + local_28,local_28);
  }
  return;
}

Assistant:

Graph<T>::Graph(int vertices)
{
  vertexCount = vertices;
  //we need to allocate the memory for the two arrays
  adjacencyList = new SinglyLinkedList<T>[vertices];
  vertexList = new GraphVertex<T>[vertices];

  for(int i = 0; i<vertexCount; i++)
  {
    //set the index of each vertex in the list to i
    vertexList[i].setIndex(i);
  }
}